

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_WS(TT_ExecContext exc,FT_Long *args)

{
  FT_Error FVar1;
  ulong local_28;
  FT_ULong tmp;
  FT_ULong I;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  tmp = *args;
  if (tmp < exc->storeSize) {
    I = (FT_ULong)args;
    args_local = (FT_Long *)exc;
    if ((exc->iniRange == 3) && (exc->storage != exc->glyfStorage)) {
      local_28 = (ulong)exc->glyfStoreSize;
      FVar1 = Update_Max(exc->memory,&local_28,8,&exc->glyfStorage,(ulong)exc->storeSize);
      *(FT_Error *)(args_local + 3) = FVar1;
      *(short *)(args_local + 0x6b) = (short)local_28;
      if ((int)args_local[3] != 0) {
        return;
      }
      memcpy((void *)args_local[0x6c],(void *)args_local[0x6a],
             (ulong)*(ushort *)(args_local + 0x6b) << 3);
      args_local[0x6a] = args_local[0x6c];
    }
    *(undefined8 *)(args_local[0x6a] + tmp * 8) = *(undefined8 *)(I + 8);
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_WS( TT_ExecContext  exc,
          FT_Long*        args )
  {
    FT_ULong  I = (FT_ULong)args[0];


    if ( BOUNDSL( I, exc->storeSize ) )
    {
      if ( exc->pedantic_hinting )
        ARRAY_BOUND_ERROR;
    }
    else
    {
      if ( exc->iniRange == tt_coderange_glyph &&
           exc->storage != exc->glyfStorage    )
      {
        FT_ULong  tmp = (FT_ULong)exc->glyfStoreSize;


        exc->error = Update_Max( exc->memory,
                                 &tmp,
                                 sizeof ( FT_Long ),
                                 (void*)&exc->glyfStorage,
                                 exc->storeSize );
        exc->glyfStoreSize = (FT_UShort)tmp;
        if ( exc->error )
          return;

        FT_ARRAY_COPY( exc->glyfStorage, exc->storage, exc->glyfStoreSize );
        exc->storage = exc->glyfStorage;
      }

      exc->storage[I] = args[1];
    }
  }